

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

int spi_write(uint handle,char *buf,uint count)

{
  int iVar1;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)count;
  ext[0].ptr = buf;
  iVar1 = pigpio_command_ext(gPigCommand,0x4a,handle,0,count,1,ext,1);
  return iVar1;
}

Assistant:

int spi_write(unsigned handle, char *buf, unsigned count)
{
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=0
   p3=count
   ## extension ##
   char buf[count]
   */

   ext[0].size = count;
   ext[0].ptr = buf;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_SPIW, handle, 0, count, 1, ext, 1);
}